

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O2

ostream * perf::operator<<(ostream *o,suite *suite)

{
  perf_case *ppVar1;
  perf_case *ppVar2;
  perf_case *ppVar3;
  perf_case *ppVar4;
  ulong uVar5;
  ostream *poVar6;
  perf_case *ppVar7;
  size_t len;
  duration *time;
  unsigned_long __val;
  perf_case *ppVar8;
  string time_str;
  string success_str;
  string num_cases_str;
  string name_str;
  string num_str;
  perf_case c;
  string local_50;
  
  std::__cxx11::to_string(&num_cases_str,(*(long *)(suite + 8) - *(long *)suite) / 0x50);
  ppVar8 = *(perf_case **)suite;
  ppVar1 = *(perf_case **)(suite + 8);
  ppVar7 = ppVar8;
  ppVar4 = ppVar8;
  ppVar2 = ppVar8;
  if (ppVar8 != ppVar1) {
    while (ppVar4 = ppVar7, ppVar7 = ppVar2 + 1, ppVar7 != ppVar1) {
      ppVar3 = ppVar2 + 1;
      ppVar2 = ppVar7;
      if ((ppVar3->name)._M_string_length <= (ppVar4->name)._M_string_length) {
        ppVar7 = ppVar4;
      }
    }
  }
  num_str._M_dataplus._M_p = (pointer)&num_str.field_2;
  num_str._M_string_length = 0;
  name_str._M_dataplus._M_p = (pointer)&name_str.field_2;
  name_str._M_string_length = 0;
  success_str._M_dataplus._M_p = (pointer)&success_str.field_2;
  success_str._M_string_length = 0;
  num_str.field_2._M_local_buf[0] = '\0';
  name_str.field_2._M_local_buf[0] = '\0';
  success_str.field_2._M_local_buf[0] = '\0';
  time_str._M_dataplus._M_p = (pointer)&time_str.field_2;
  time_str._M_string_length = 0;
  time_str.field_2._M_local_buf[0] = '\0';
  uVar5 = (ppVar4->name)._M_string_length + 1;
  len = 0x1e;
  if (0x1e < uVar5) {
    len = uVar5;
  }
  __val = 1;
  for (; ppVar8 != ppVar1; ppVar8 = ppVar8 + 1) {
    perf_case::perf_case(&c,ppVar8);
    std::__cxx11::to_string(&local_50,__val);
    std::__cxx11::string::operator=((string *)&num_str,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lengthen_string(&num_str,num_cases_str._M_string_length,' ');
    std::operator+(&local_50,&c.name,' ');
    std::__cxx11::string::operator=((string *)&name_str,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lengthen_string(&name_str,len,'.');
    std::__cxx11::string::assign((char *)&success_str);
    format_duration_abi_cxx11_(&local_50,(perf *)&c.time,time);
    std::__cxx11::string::operator=((string *)&time_str,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    poVar6 = std::operator<<(o,(string *)&num_str);
    poVar6 = std::operator<<(poVar6,'/');
    poVar6 = std::operator<<(poVar6,(string *)&num_cases_str);
    poVar6 = std::operator<<(poVar6,' ');
    poVar6 = std::operator<<(poVar6,"Case #");
    poVar6 = std::operator<<(poVar6,(string *)&num_str);
    poVar6 = std::operator<<(poVar6,": ");
    poVar6 = std::operator<<(poVar6,(string *)&name_str);
    poVar6 = std::operator<<(poVar6,(string *)&success_str);
    poVar6 = std::operator<<(poVar6,(string *)&time_str);
    std::operator<<(poVar6,'\n');
    perf_case::~perf_case(&c);
    __val = __val + 1;
  }
  std::__cxx11::string::~string((string *)&time_str);
  std::__cxx11::string::~string((string *)&success_str);
  std::__cxx11::string::~string((string *)&name_str);
  std::__cxx11::string::~string((string *)&num_str);
  std::__cxx11::string::~string((string *)&num_cases_str);
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const suite &suite)
    {
        auto num_cases = suite.m_cases.size();
        auto num_cases_str = std::to_string(num_cases);

        auto max_name_length = std::max_element(std::begin(suite.m_cases), std::end(suite.m_cases), [](const perf_case &a, const perf_case &b)
                                                { return a.name.size() < b.name.size(); })
                                   ->name.size();

        auto num = 0ul;
        auto num_str = std::string(), name_str = std::string(), success_str = std::string(), time_str = std::string();
        for (auto c : suite.m_cases)
        {
            num++;
            num_str = std::to_string(num);
            lengthen_string(num_str, num_cases_str.length());
            name_str = c.name + ' ';
            if (30 > max_name_length + 1)
            {
                lengthen_string(name_str, 30, '.');
            }
            else
            {
                lengthen_string(name_str, max_name_length + 1, '.');
            }
            if (c.success)
                success_str = "  Passed  ";
            else
                success_str = "  Failed  ";
            time_str = format_duration(c.time);

            o << num_str << '/' << num_cases_str << ' ' << "Case #" << num_str << ": " << name_str << success_str << time_str << '\n';
        }

        return o;
    }